

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O1

int SUNNonlinSolInitialize_Newton(SUNNonlinearSolver NLS)

{
  long *plVar1;
  int iVar2;
  
  iVar2 = -0x385;
  if ((((NLS != (SUNNonlinearSolver)0x0) && (plVar1 = (long *)NLS->content, *plVar1 != 0)) &&
      (plVar1[2] != 0)) && (plVar1[3] != 0)) {
    *(undefined4 *)(plVar1 + 5) = 0;
    plVar1[7] = 0;
    plVar1[8] = 0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int SUNNonlinSolInitialize_Newton(SUNNonlinearSolver NLS)
{
  /* check that the nonlinear solver is non-null */
  if (NLS == NULL) return(SUN_NLS_MEM_NULL);

  /* check that all required function pointers have been set */
  if ( (NEWTON_CONTENT(NLS)->Sys    == NULL) ||
       (NEWTON_CONTENT(NLS)->LSolve == NULL) ||
       (NEWTON_CONTENT(NLS)->CTest  == NULL) ) {
    return(SUN_NLS_MEM_NULL);
  }

  /* reset the total number of iterations and convergence failures */
  NEWTON_CONTENT(NLS)->niters     = 0;
  NEWTON_CONTENT(NLS)->nconvfails = 0;

  /* reset the Jacobian status */
  NEWTON_CONTENT(NLS)->jcur = SUNFALSE;

  return(SUN_NLS_SUCCESS);
}